

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLAttribute * __thiscall tinyxml2::XMLElement::FindAttribute(XMLElement *this,char *name)

{
  XMLAttribute *pXVar1;
  bool bVar2;
  char *p;
  XMLAttribute **ppXVar3;
  
  ppXVar3 = &this->_rootAttribute;
  while( true ) {
    pXVar1 = *ppXVar3;
    if (pXVar1 == (XMLAttribute *)0x0) {
      return (XMLAttribute *)0x0;
    }
    p = StrPair::GetStr(&pXVar1->_name);
    bVar2 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar2) break;
    ppXVar3 = &pXVar1->_next;
  }
  return pXVar1;
}

Assistant:

const XMLAttribute* XMLElement::FindAttribute( const char* name ) const
{
    for( XMLAttribute* a = _rootAttribute; a; a = a->_next ) {
        if ( XMLUtil::StringEqual( a->Name(), name ) ) {
            return a;
        }
    }
    return 0;
}